

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O0

void pp_crypto_hash_sha2_512_swap_bytes(puint64 *data,puint words)

{
  puint local_14;
  puint64 *ppStack_10;
  puint words_local;
  puint64 *data_local;
  
  local_14 = words;
  ppStack_10 = data;
  while (local_14 != 0) {
    *ppStack_10 = *ppStack_10 >> 0x38 | (*ppStack_10 & 0xff00) << 0x28 |
                  (*ppStack_10 & 0xff0000) << 0x18 | (*ppStack_10 & 0xff000000) << 8 |
                  *ppStack_10 >> 8 & 0xff000000 | *ppStack_10 >> 0x18 & 0xff0000 |
                  *ppStack_10 >> 0x28 & 0xff00 | *ppStack_10 << 0x38;
    ppStack_10 = ppStack_10 + 1;
    local_14 = local_14 - 1;
  }
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_512_swap_bytes (puint64	*data,
				    puint	words)
{
#ifdef PLIBSYS_IS_BIGENDIAN
	P_UNUSED (data);
	P_UNUSED (words);
#else
	while (words-- > 0) {
		*data = PUINT64_TO_BE (*data);
		++data;
	}
#endif
}